

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O3

bool __thiscall Flatten::inlineFunction(Flatten *this,Function *F,Function *Caller)

{
  Function *pFVar1;
  mapped_type pBVar2;
  mapped_type pBVar3;
  CallBase *this_00;
  iterator iVar4;
  Flatten *pFVar5;
  Function *pFVar6;
  char cVar7;
  long lVar8;
  LLVMContext *pLVar9;
  mapped_type pBVar10;
  mapped_type *ppBVar11;
  mapped_type *ppBVar12;
  CallBase *pCVar13;
  Value *pVVar14;
  FunctionType *this_01;
  Type *pTVar15;
  PHINode *this_02;
  Function *pFVar16;
  UnreachableInst *this_03;
  SwitchInst *pSVar17;
  _Base_ptr p_Var18;
  FunctionPass *pFVar19;
  mapped_type pBVar20;
  Function *pFVar21;
  char *__function;
  CallInst **ppCVar22;
  Function *pFVar23;
  mapped_type pBVar24;
  Function *pFVar25;
  iterator_range<llvm::Argument_*> iVar26;
  ArrayRef<llvm::Value_*> Args;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> CallSites;
  BasicBlock *ParentBlock;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> CallArgs;
  map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToOrigParent;
  map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToRet;
  CallInst **local_288;
  iterator iStack_280;
  CallInst **local_278;
  Twine *local_268;
  CallBase *local_260;
  mapped_type local_258;
  Child local_250 [2];
  Value *local_228;
  long lStack_220;
  long local_218;
  Function *local_208;
  Argument *local_200;
  Flatten *local_1f8;
  Argument *local_1f0;
  _Rb_tree<llvm::Instruction_*,_std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr p_Stack_198;
  BlockFrequencyInfo *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [32];
  SmallVector<llvm::WeakTrackingVH,_8U> local_158;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [64];
  bool local_38;
  
  local_1f8 = this;
  cVar7 = llvm::Function::hasFnAttribute((AttrKind)F);
  if ((cVar7 != '\0') || (cVar7 = llvm::GlobalValue::isDeclaration(), cVar7 != '\0')) {
    return false;
  }
  local_288 = (CallInst **)0x0;
  iStack_280._M_current = (CallInst **)0x0;
  local_278 = (CallInst **)0x0;
  pFVar23 = Caller + 0x48;
  pFVar16 = *(Function **)(Caller + 0x50);
  if (pFVar16 != pFVar23) {
    do {
      pFVar21 = pFVar16 + -0x18;
      if (pFVar16 == (Function *)0x0) {
        pFVar21 = (Function *)0x0;
      }
      for (pFVar25 = *(Function **)(pFVar21 + 0x30); pFVar25 != pFVar21 + 0x28;
          pFVar25 = *(Function **)(pFVar25 + 8)) {
        if (pFVar25 == (Function *)0x0) {
          __function = 
          "static bool llvm::isa_impl_cl<llvm::CallInst, const llvm::Instruction *>::doit(const From *) [To = llvm::CallInst, From = const llvm::Instruction *]"
          ;
          goto LAB_00114db5;
        }
        local_1b8._0_8_ = pFVar25 + -0x18;
        pFVar6 = (Function *)0x0;
        if (pFVar25[-8] == (Function)0x53) {
          pFVar1 = *(Function **)(pFVar25 + -0x38);
          if (pFVar1 == (Function *)0x0) {
            __function = 
            "static bool llvm::isa_impl_cl<llvm::InlineAsm, const llvm::Value *>::doit(const From *) [To = llvm::InlineAsm, From = const llvm::Value *]"
            ;
            goto LAB_00114db5;
          }
          pFVar6 = (Function *)local_1b8._0_8_;
          if (((pFVar1[0x10] == (Function)0x0) && (pFVar1 == F)) &&
             (*(long *)(pFVar1 + 0x18) == *(long *)(pFVar25 + 0x30))) {
            if (iStack_280._M_current == local_278) {
              std::vector<llvm::CallInst*,std::allocator<llvm::CallInst*>>::
              _M_realloc_insert<llvm::CallInst*const&>
                        ((vector<llvm::CallInst*,std::allocator<llvm::CallInst*>> *)&local_288,
                         iStack_280,(CallInst **)local_1b8);
              pFVar6 = (Function *)local_1b8._0_8_;
            }
            else {
              *iStack_280._M_current = (CallInst *)local_1b8._0_8_;
              iStack_280._M_current = iStack_280._M_current + 1;
            }
          }
        }
        local_1b8._0_8_ = pFVar6;
      }
      pFVar16 = *(Function **)(pFVar16 + 8);
    } while (pFVar16 != pFVar23);
  }
  lVar8 = (long)iStack_280._M_current - (long)local_288 >> 3;
  if (lVar8 == 0) {
    pCVar13 = (CallBase *)0x0;
LAB_00114c6e:
    if (local_288 == (CallInst **)0x0) goto LAB_00114c80;
  }
  else {
    if (lVar8 != 1) {
      local_228 = (Value *)0x0;
      lStack_220 = 0;
      local_218 = 0;
      local_1a0 = (_Base_ptr)(local_1b8 + 8);
      local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
      local_1a8 = (_Base_ptr)0x0;
      local_190 = (BlockFrequencyInfo *)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Stack_198 = local_1a0;
      pLVar9 = (LLVMContext *)llvm::Function::getContext();
      local_208 = pFVar23;
      llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
      local_268 = (Twine *)llvm::BasicBlock::Create
                                     (pLVar9,(Twine *)&local_250[0].ptrAndLength,Caller,
                                      (BasicBlock *)0x0);
      iVar4._M_current = iStack_280._M_current;
      if (local_288 != iStack_280._M_current) {
        ppCVar22 = local_288;
        do {
          pCVar13 = &(*ppCVar22)->super_CallBase;
          pBVar2 = *(mapped_type *)&pCVar13->field_0x28;
          pBVar3 = *(mapped_type *)&pCVar13->field_0x20;
          local_258 = pBVar2;
          llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
          pBVar20 = pBVar3 + -0x18;
          if (pBVar3 == (mapped_type)0x0) {
            pBVar20 = (mapped_type)0x0;
          }
          pBVar24 = (mapped_type)0x0;
          if (pBVar3 != pBVar2 + 0x28) {
            pBVar24 = pBVar20;
          }
          pBVar10 = (mapped_type)
                    llvm::BasicBlock::splitBasicBlock(pBVar2,pBVar24 + 0x18,local_250,0);
          pBVar20 = local_258;
          local_250[0]._0_8_ = pCVar13;
          ppBVar11 = std::
                     map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                     ::operator[]((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                                   *)&local_1e8,(key_type *)&local_250[0].twine);
          *ppBVar11 = pBVar20;
          ppBVar12 = std::
                     map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                     ::operator[]((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                                   *)local_1b8,&local_258);
          *ppBVar12 = pBVar10;
          llvm::BasicBlock::getFirstNonPHI();
          llvm::Instruction::moveBefore(&pCVar13->super_Instruction);
          llvm::BranchInst::Create((BasicBlock *)local_268,local_258);
          llvm::Instruction::eraseFromParent();
          ppCVar22 = ppCVar22 + 1;
        } while (ppCVar22 != iVar4._M_current);
      }
      if ((*(long *)(F + 0x60) != 0) &&
         (iVar26 = llvm::Function::args(F), iVar26.begin_iterator != iVar26.end_iterator)) {
        local_260 = (CallBase *)((ulong)local_260 & 0xffffffff00000000);
        do {
          iVar4._M_current = iStack_280._M_current;
          ppCVar22 = local_288;
          local_200 = iVar26.end_iterator;
          local_1f0 = iVar26.begin_iterator;
          pTVar15 = *(Type **)local_1f0;
          llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
          pCVar13 = (CallBase *)
                    llvm::PHINode::Create
                              (pTVar15,(uint)((ulong)((long)iVar4._M_current - (long)ppCVar22) >> 3)
                               ,(Twine *)&local_250[0].ptrAndLength,(BasicBlock *)local_268);
          iVar4._M_current = iStack_280._M_current;
          for (ppCVar22 = local_288; ppCVar22 != iVar4._M_current; ppCVar22 = ppCVar22 + 1) {
            this_00 = &(*ppCVar22)->super_CallBase;
            pVVar14 = llvm::CallBase::getArgOperand(this_00,(uint)local_260);
            local_250[0]._0_8_ = this_00;
            ppBVar11 = std::
                       map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                       ::operator[]((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                                     *)&local_1e8,(key_type *)&local_250[0].twine);
            llvm::PHINode::addIncoming((PHINode *)pCVar13,pVVar14,*ppBVar11);
          }
          if (pCVar13 == (CallBase *)0x0) {
            __function = 
            "static bool llvm::isa_impl_cl<llvm::Value, const llvm::PHINode *>::doit(const From *) [To = llvm::Value, From = const llvm::PHINode *]"
            ;
LAB_00114db5:
            __assert_fail("Val && \"isa<> used on a null pointer\"",
                          "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,__function);
          }
          local_250[0]._0_8_ = pCVar13;
          std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
                    ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)&local_228,
                     (Value **)&local_250[0].twine);
          local_260 = (CallBase *)CONCAT44(local_260._4_4_,(uint)local_260 + 1);
          iVar26.end_iterator = local_200;
          iVar26.begin_iterator = local_1f0 + 0x28;
        } while (local_1f0 + 0x28 != local_200);
      }
      this_01 = llvm::Function::getFunctionType(F);
      lVar8 = lStack_220;
      pVVar14 = local_228;
      llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
      Args.Length = (size_type)local_250;
      Args.Data = (Value **)(lVar8 - (long)pVVar14 >> 3);
      pCVar13 = &llvm::CallInst::Create
                           ((CallInst *)this_01,(FunctionType *)F,pVVar14,Args,local_268,
                            (BasicBlock *)Caller)->super_CallBase;
      iVar4._M_current = iStack_280._M_current;
      for (ppCVar22 = local_288; ppCVar22 != iVar4._M_current; ppCVar22 = ppCVar22 + 1) {
        llvm::Value::replaceAllUsesWith((Value *)*ppCVar22);
        llvm::Instruction::eraseFromParent();
      }
      pLVar9 = (LLVMContext *)llvm::Function::getContext();
      pTVar15 = (Type *)llvm::Type::getInt32Ty(pLVar9);
      iVar4._M_current = iStack_280._M_current;
      ppCVar22 = local_288;
      llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
      this_02 = llvm::PHINode::Create
                          (pTVar15,(uint)((ulong)((long)iVar4._M_current - (long)ppCVar22) >> 3),
                           (Twine *)&local_250[0].ptrAndLength,&pCVar13->super_Instruction);
      for (pFVar23 = *(Function **)(Caller + 0x50); pFVar23 != local_208;
          pFVar23 = *(Function **)(pFVar23 + 8)) {
        pFVar16 = pFVar23 + -0x18;
        if (pFVar23 == (Function *)0x0) {
          pFVar16 = (Function *)0x0;
        }
        pFVar21 = *(Function **)(pFVar16 + 0x30);
        if (pFVar21 != pFVar16 + 0x28) {
          lVar8 = 1;
          do {
            pFVar21 = *(Function **)(pFVar21 + 8);
            lVar8 = lVar8 + -1;
          } while (pFVar21 != pFVar16 + 0x28);
          if (lVar8 == 0) {
            lVar8 = llvm::BasicBlock::getFirstNonPHI();
            if (lVar8 == 0) {
              __assert_fail("instr && \"basic block contains no non-phi instructions\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/MergeCallsPass.h"
                            ,0x1e,
                            "static BasicBlock *(anonymous namespace)::MergeCalls::getUnreachableBlock(Function *)"
                           );
            }
            if (*(char *)(lVar8 + 0x10) == '\"') goto LAB_00114b82;
          }
        }
      }
      pLVar9 = (LLVMContext *)llvm::Function::getContext();
      llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
      pFVar16 = (Function *)
                llvm::BasicBlock::Create
                          (pLVar9,(Twine *)&local_250[0].ptrAndLength,Caller,(BasicBlock *)0x0);
      this_03 = (UnreachableInst *)llvm::User::operator_new(0x40,0);
      pLVar9 = (LLVMContext *)llvm::Function::getContext();
      llvm::UnreachableInst::UnreachableInst(this_03,pLVar9,(BasicBlock *)pFVar16);
LAB_00114b82:
      pSVar17 = llvm::SwitchInst::Create
                          ((Value *)this_02,(BasicBlock *)pFVar16,(uint)local_190,
                           (BasicBlock *)local_268);
      local_260 = pCVar13;
      if (local_1a0 != (_Rb_tree_node_base *)(local_1b8 + 8)) {
        pCVar13 = (CallBase *)0x0;
        p_Var18 = local_1a0;
        do {
          pLVar9 = (LLVMContext *)llvm::Function::getContext();
          local_250[0].ptrAndLength.length._0_4_ = 0x20;
          local_250[0]._0_8_ = pCVar13;
          pVVar14 = (Value *)llvm::ConstantInt::get(pLVar9,(APInt *)&local_250[0].ptrAndLength);
          if ((0x40 < (uint)local_250[0]._8_4_) &&
             ((CallBase *)local_250[0]._0_8_ != (CallBase *)0x0)) {
            operator_delete__((void *)local_250[0]._0_8_);
          }
          llvm::PHINode::addIncoming(this_02,pVVar14,*(BasicBlock **)(p_Var18 + 1));
          llvm::SwitchInst::addCase((ConstantInt *)pSVar17,(BasicBlock *)pVVar14);
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
          pCVar13 = (CallBase *)&pCVar13->field_0x1;
        } while (p_Var18 != (_Rb_tree_node_base *)(local_1b8 + 8));
      }
      std::
      _Rb_tree<llvm::Instruction_*,_std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_1e8);
      std::
      _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
      ::~_Rb_tree((_Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                   *)local_1b8);
      pCVar13 = local_260;
      if (local_228 != (Value *)0x0) {
        operator_delete(local_228,local_218 - (long)local_228);
        pCVar13 = local_260;
      }
      goto LAB_00114c6e;
    }
    pCVar13 = &(*local_288)->super_CallBase;
  }
  operator_delete(local_288,(long)local_278 - (long)local_288);
LAB_00114c80:
  pFVar5 = local_1f8;
  if (pCVar13 != (CallBase *)0x0) {
    pFVar19 = local_1f8->reg2mem;
    if (pFVar19 == (FunctionPass *)0x0) {
      pFVar19 = (FunctionPass *)llvm::createDemoteRegisterToMemoryPass();
      pFVar5->reg2mem = pFVar19;
    }
    (**(code **)(*(long *)pFVar19 + 0x88))(pFVar19,Caller);
    local_1b8._0_8_ = (CallGraph *)0x0;
    local_1b8._8_8_ = (_func_AssumptionCache_ptr_intptr_t_Function_ptr *)0x0;
    local_1a0 = (_Base_ptr)0x0;
    p_Stack_198 = (_Base_ptr)0x0;
    local_190 = (BlockFrequencyInfo *)0x0;
    local_180._0_4_ = 0;
    local_180._4_4_ = 4;
    local_158.super_SmallVectorImpl<llvm::WeakTrackingVH>.
    super_SmallVectorTemplateBase<llvm::WeakTrackingVH,_false>.
    super_SmallVectorTemplateCommon<llvm::WeakTrackingVH,_void>.super_SmallVectorBase<unsigned_int>.
    BeginX = &local_158.super_SmallVectorStorage<llvm::WeakTrackingVH,_8U>;
    local_158.super_SmallVectorImpl<llvm::WeakTrackingVH>.
    super_SmallVectorTemplateBase<llvm::WeakTrackingVH,_false>.
    super_SmallVectorTemplateCommon<llvm::WeakTrackingVH,_void>.super_SmallVectorBase<unsigned_int>.
    Size = 0;
    local_158.super_SmallVectorImpl<llvm::WeakTrackingVH>.
    super_SmallVectorTemplateBase<llvm::WeakTrackingVH,_false>.
    super_SmallVectorTemplateCommon<llvm::WeakTrackingVH,_void>.super_SmallVectorBase<unsigned_int>.
    Capacity = 8;
    local_80._0_4_ = 0;
    local_80._4_4_ = 8;
    local_38 = true;
    local_188 = local_178;
    local_88 = local_78;
    lVar8 = llvm::InlineFunction
                      (pCVar13,(InlineFunctionInfo *)local_1b8,(AAResults *)0x0,true,(Function *)0x0
                      );
    if ((lVar8 == 0) && (cVar7 = llvm::Function::isDefTriviallyDead(), cVar7 != '\0')) {
      llvm::Function::eraseFromParent();
    }
    if (local_88 != local_78) {
      free(local_88);
    }
    llvm::SmallVector<llvm::WeakTrackingVH,_8U>::~SmallVector(&local_158);
    if (local_188 != local_178) {
      free(local_188);
    }
    return lVar8 == 0;
  }
  __assert_fail("CallSite && \"MergeCalls did not return a unified callsite\"",
                "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/FlattenPass.cpp"
                ,0x23,"bool Flatten::inlineFunction(Function *, Function *)");
}

Assistant:

bool Flatten::inlineFunction(Function *F, Function *Caller) {
  if (F->hasFnAttribute(Attribute::NoInline)) {
    // Function not eligible for inlining. Bail out.
    return false;
  }

  if (F->isDeclaration()) {
    // Function is declared, and not defined. Bail out.
    return false;
  }

  // First, run the MergeCalls pass on it:
  CallInst *CallSite = MergeCalls::mergeCallSites(Caller, F);
  assert(CallSite && "MergeCalls did not return a unified callsite");

  if (reg2mem == nullptr)
    reg2mem = llvm::createDemoteRegisterToMemoryPass();
  reg2mem->runOnFunction(*Caller);

  // Coerce LLVM to inline the function.
  InlineFunctionInfo IFI;
  if (!InlineFunction(cast<CallBase>(*CallSite), IFI).isSuccess()) {
    return false;
  }

  // If F is now completely dead, we can erase it from the module.
  if (F->isDefTriviallyDead()) {
    F->eraseFromParent();
  }

  return true;
}